

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O2

CURLcode cw_pause_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  curl_trc_feat *pcVar1;
  long lVar2;
  uint type_00;
  _Bool _Var3;
  _Bool _Var4;
  CURLcode CVar5;
  undefined8 *puVar6;
  void *pvVar7;
  ulong nbytes;
  bufq *q;
  size_t nwritten;
  uint local_44;
  Curl_cwriter *local_40;
  void *local_38;
  
  pvVar7 = writer->ctx;
  local_40 = writer;
  _Var3 = Curl_cwriter_is_content_decoding(data);
  if (((*(long *)((long)pvVar7 + 0x20) != 0) && (_Var4 = Curl_cwriter_is_paused(data), !_Var4)) &&
     (CVar5 = cw_pause_flush(data,local_40), CVar5 != CURLE_OK)) {
    return CVar5;
  }
  local_44 = type & 0xffffff7f;
  nbytes = 0;
  local_38 = pvVar7;
  while( true ) {
    pvVar7 = local_38;
    if ((*(long *)((long)local_38 + 0x20) != 0) || (_Var4 = Curl_cwriter_is_paused(data), _Var4)) {
      while( true ) {
        nwritten = 0;
        lVar2 = *(long *)((long)pvVar7 + 0x20);
        if ((lVar2 == 0) || (((type & 1U) == 0 || (*(int *)(lVar2 + 0x48) != type)))) {
          puVar6 = (undefined8 *)(*Curl_ccalloc)(1,0x50);
          if (puVar6 == (undefined8 *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          q = (bufq *)(puVar6 + 1);
          *(int *)(puVar6 + 9) = type;
          if ((type & 1U) == 0) {
            Curl_bufq_init(q,blen,1);
          }
          else {
            Curl_bufq_init2(q,0x4000,1,3);
          }
          *puVar6 = *(undefined8 *)((long)local_38 + 0x20);
          *(undefined8 **)((long)local_38 + 0x20) = puVar6;
          pvVar7 = local_38;
        }
        else {
          q = (bufq *)(lVar2 + 8);
        }
        CVar5 = Curl_bufq_cwrite(q,buf,blen,&nwritten);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"[PAUSE] buffer %zu more bytes of type %x, total=%zu -> %d",nwritten,
                         (ulong)(uint)type,*(long *)((long)pvVar7 + 0x28) + nbytes,(ulong)CVar5);
        }
        if (CVar5 != CURLE_OK) break;
        buf = buf + nwritten;
        *(long *)((long)pvVar7 + 0x28) = *(long *)((long)pvVar7 + 0x28) + nwritten;
        blen = blen - nwritten;
        if (blen == 0) {
          return CURLE_OK;
        }
      }
      return CVar5;
    }
    nbytes = 0x1000;
    if (blen < 0x1000) {
      nbytes = blen;
    }
    if ((_Var3 & (byte)type) == 0) {
      nbytes = blen;
    }
    type_00 = type;
    if (nbytes < blen) {
      type_00 = local_44;
    }
    CVar5 = Curl_cwriter_write(data,local_40->next,type_00,buf,nbytes);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"[PAUSE] writing %zu/%zu bytes of type %x -> %d",nbytes,blen,
                     (ulong)type_00,(ulong)CVar5);
    }
    if (CVar5 != CURLE_OK) break;
    buf = buf + nbytes;
    blen = blen - nbytes;
    if (blen == 0) {
      return CURLE_OK;
    }
  }
  return CVar5;
}

Assistant:

static CURLcode cw_pause_write(struct Curl_easy *data,
                               struct Curl_cwriter *writer, int type,
                               const char *buf, size_t blen)
{
  struct cw_pause_ctx *ctx = writer->ctx;
  CURLcode result = CURLE_OK;
  size_t wlen = 0;
  bool decoding = Curl_cwriter_is_content_decoding(data);

  if(ctx->buf && !Curl_cwriter_is_paused(data)) {
    result = cw_pause_flush(data, writer);
    if(result)
      return result;
  }

  while(!ctx->buf && !Curl_cwriter_is_paused(data)) {
    int wtype = type;
    DEBUGASSERT(!ctx->buf);
    /* content decoding might blow up size considerably, write smaller
     * chunks to make pausing need buffer less. */
    wlen = (decoding && (type & CLIENTWRITE_BODY)) ?
           CURLMIN(blen, CW_PAUSE_DEC_WRITE_CHUNK) : blen;
    if(wlen < blen)
      wtype &= ~CLIENTWRITE_EOS;
    result = Curl_cwriter_write(data, writer->next, wtype, buf, wlen);
    CURL_TRC_WRITE(data, "[PAUSE] writing %zu/%zu bytes of type %x -> %d",
                   wlen, blen, wtype, result);
    if(result)
      return result;
    buf += wlen;
    blen -= wlen;
    if(!blen)
      return result;
  }

  do {
    size_t nwritten = 0;
    if(ctx->buf && (ctx->buf->type == type) && (type & CLIENTWRITE_BODY)) {
      /* same type and body, append to current buffer which has a soft
       * limit and should take everything up to OOM. */
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    else {
      /* Need a new buf, type changed */
      struct cw_pause_buf *cwbuf = cw_pause_buf_create(type, blen);
      if(!cwbuf)
        return CURLE_OUT_OF_MEMORY;
      cwbuf->next = ctx->buf;
      ctx->buf = cwbuf;
      result = Curl_bufq_cwrite(&ctx->buf->b, buf, blen, &nwritten);
    }
    CURL_TRC_WRITE(data, "[PAUSE] buffer %zu more bytes of type %x, "
                   "total=%zu -> %d", nwritten, type, ctx->buf_total + wlen,
                   result);
    if(result)
      return result;
    buf += nwritten;
    blen -= nwritten;
    ctx->buf_total += nwritten;
  } while(blen);

  return result;
}